

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_BoundingBox * __thiscall
ON_SubDMeshFragmentIterator::ControlNetQuadBoundingBox
          (ON_BoundingBox *__return_storage_ptr__,ON_SubDMeshFragmentIterator *this)

{
  ON_SubDMeshFragment *this_00;
  ON_SubDMeshFragmentIterator local_frit;
  ON_SubDMeshFragmentIterator local_c8;
  ON_BoundingBox local_48;
  
  ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__);
  if (this->m_bFromFaceFragments == true) {
    ON_Geometry::BoundingBox((ON_BoundingBox *)&local_c8,&(this->m_subd).super_ON_Geometry);
    (__return_storage_ptr__->m_max).y =
         (double)local_c8.m_subd.m_subdimple_sp.
                 super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (__return_storage_ptr__->m_max).z =
         (double)local_c8.m_subd.m_subdimple_sp.
                 super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (__return_storage_ptr__->m_min).z =
         (double)local_c8.m_subd.super_ON_Geometry.super_ON_Object._vptr_ON_Object;
    (__return_storage_ptr__->m_max).x =
         (double)local_c8.m_subd.super_ON_Geometry.super_ON_Object.m_userdata_list;
    (__return_storage_ptr__->m_min).x =
         (double)local_c8.m_limit_mesh.m_impl_sp.
                 super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (__return_storage_ptr__->m_min).y =
         (double)local_c8.m_limit_mesh.m_impl_sp.
                 super___shared_ptr<ON_SubDMeshImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    ON_SubDMeshFragmentIterator(&local_c8,this);
    this_00 = FirstFragment(&local_c8);
    while (this_00 != (ON_SubDMeshFragment *)0x0) {
      ON_SubDMeshFragment::ControlNetQuadBoundingBox(&local_48,this_00);
      ON_BoundingBox::Union(__return_storage_ptr__,&local_48);
      this_00 = NextFragment(&local_c8);
    }
    ~ON_SubDMeshFragmentIterator(&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_SubDMeshFragmentIterator::ControlNetQuadBoundingBox() const
{
  ON_BoundingBox bbox;
  if (m_bFromFaceFragments)
    bbox = m_subd.BoundingBox();
  else
  {
    ON_SubDMeshFragmentIterator local_frit(*this);
    for (const ON_SubDMeshFragment* fragment = local_frit.FirstFragment(); nullptr != fragment; fragment = local_frit.NextFragment())
    {
      bbox.Union(fragment->ControlNetQuadBoundingBox());
    }
  }
  return bbox;
}